

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

filepos_t UpdateBlockSize(matroska_block *Element,bool_t bWithDefault,bool_t bForceWithoutMandatory,
                         int ForProfile)

{
  ebml_master *peVar1;
  char cVar2;
  byte bVar3;
  long lVar4;
  ebml_context *peVar5;
  ebml_master *peVar6;
  ebml_integer *peVar7;
  int64_t iVar8;
  size_t sVar9;
  filepos_t fVar10;
  void *pvVar11;
  filepos_t fVar12;
  ulong uVar13;
  MatroskaTrackEncodingCompAlgo local_58;
  MatroskaContentEncodingScope local_50;
  
  if (Element == (matroska_block *)0x0) {
    __assert_fail("(const void*)(Element)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x79f,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
  }
  lVar4 = (**(code **)((long)(Element->Base).Base.Base.Base.VMT + 0xa0))();
  if (lVar4 == 0) goto switchD_0010d6b7_default;
  if (Element->Lacing == '\x04') {
    cVar2 = GetBestLacingType(Element,ForProfile);
    Element->Lacing = cVar2;
  }
  peVar6 = Element->WriteTrack;
  if (peVar6 == (ebml_master *)0x0) {
    __assert_fail("Element->WriteTrack!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x7a8,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
  }
  peVar5 = MATROSKA_getContextContentEncodings();
  peVar6 = (ebml_master *)EBML_MasterFindFirstElt(peVar6,peVar5,0,0,0);
  local_50 = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
  local_58 = MATROSKA_TRACK_ENCODING_COMP_NONE;
  if (peVar6 == (ebml_master *)0x0) {
    peVar7 = (ebml_integer *)0x0;
  }
  else {
    peVar5 = MATROSKA_getContextContentEncoding();
    peVar7 = (ebml_integer *)0x0;
    peVar6 = (ebml_master *)EBML_MasterFindFirstElt(peVar6,peVar5,0,0,0);
    if ((peVar6->Base).Base.Children != (nodetree *)0x0) {
      peVar1 = (ebml_master *)(peVar6->Base).Base.Next;
      if (peVar6 == peVar1) {
        __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x7af,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
      }
      if (peVar1 != (ebml_master *)0x0) {
        return -3;
      }
      peVar5 = MATROSKA_getContextContentEncodingScope();
      peVar7 = (ebml_integer *)EBML_MasterFindFirstElt(peVar6,peVar5,0,0,0);
      if (peVar7 == (ebml_integer *)0x0) {
        local_50 = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
      }
      else {
        iVar8 = EBML_IntegerValue(peVar7);
        local_50 = (MatroskaContentEncodingScope)iVar8;
      }
      peVar5 = MATROSKA_getContextContentCompression();
      peVar6 = (ebml_master *)EBML_MasterFindFirstElt(peVar6,peVar5,0,0,0);
      if (peVar6 == (ebml_master *)0x0) {
        return -3;
      }
      peVar5 = MATROSKA_getContextContentCompAlgo();
      peVar7 = (ebml_integer *)EBML_MasterFindFirstElt(peVar6,peVar5,1,1,ForProfile);
      if (peVar7 == (ebml_integer *)0x0) {
        return -3;
      }
      iVar8 = EBML_IntegerValue(peVar7);
      local_58 = (MatroskaTrackEncodingCompAlgo)iVar8;
      if (local_58 != MATROSKA_TRACK_ENCODING_COMP_ZLIB) {
        if (local_58 != MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP) {
          return -3;
        }
        peVar5 = MATROSKA_getContextContentCompSettings();
        peVar7 = (ebml_integer *)EBML_MasterFindFirstElt(peVar6,peVar5,0,0,0);
        local_58 = MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP;
      }
    }
  }
  switch(Element->Lacing) {
  case '\0':
    if (((Element->SizeList)._Used & 0xfffffffffffffffc) != 4) {
      __assert_fail("ARRAYCOUNT(Element->SizeList,int32_t) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x7d1,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
    }
    sVar9 = GetBlockHeadSize(Element);
    uVar13 = 0;
    break;
  case '\x01':
    sVar9 = GetBlockHeadSize(Element);
    for (uVar13 = 0; sVar9 = sVar9 + 1, uVar13 < ((Element->SizeList)._Used >> 2) - 1;
        uVar13 = uVar13 + 1) {
      fVar12 = GetBlockFrameSize(Element,uVar13,&peVar7->Base,local_58,local_50);
      sVar9 = sVar9 + fVar12 + fVar12 / 0xff;
    }
    break;
  case '\x02':
    sVar9 = GetBlockHeadSize(Element);
    lVar4 = sVar9 + 1;
    for (uVar13 = 0; uVar13 < (Element->SizeList)._Used >> 2; uVar13 = uVar13 + 1) {
      fVar12 = GetBlockFrameSize(Element,uVar13,&peVar7->Base,local_58,local_50);
      lVar4 = lVar4 + fVar12;
    }
    goto LAB_0010d874;
  case '\x03':
    sVar9 = GetBlockHeadSize(Element);
    fVar12 = GetBlockFrameSize(Element,0,&peVar7->Base,local_58,local_50);
    bVar3 = EBML_CodedSizeLength(fVar12,'\0',1);
    sVar9 = sVar9 + fVar12 + (ulong)bVar3 + 1;
    for (uVar13 = 1; uVar13 < ((Element->SizeList)._Used >> 2) - 1; uVar13 = uVar13 + 1) {
      fVar10 = GetBlockFrameSize(Element,uVar13,&peVar7->Base,local_58,local_50);
      bVar3 = EBML_CodedSizeLengthSigned(fVar10 - fVar12,'\0');
      sVar9 = sVar9 + fVar10 + (ulong)bVar3;
      fVar12 = fVar10;
    }
    break;
  default:
    goto switchD_0010d6b7_default;
  }
  fVar12 = GetBlockFrameSize(Element,uVar13,&peVar7->Base,local_58,local_50);
  lVar4 = fVar12 + sVar9;
LAB_0010d874:
  (Element->Base).Base.DataSize = lVar4;
switchD_0010d6b7_default:
  pvVar11 = Node_InheritedVMT((node *)Element,0x4e494245);
  fVar12 = (**(code **)((long)pvVar11 + 0x98))
                     (Element,bWithDefault,bForceWithoutMandatory,ForProfile);
  return fVar12;
}

Assistant:

static filepos_t UpdateBlockSize(matroska_block *Element, bool_t bWithDefault, bool_t bForceWithoutMandatory, int ForProfile)
{
    MatroskaContentEncodingScope CompressionScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
    if (EBML_ElementNeedsDataSizeUpdate(Element, bWithDefault))
    {
        ebml_element *Header = NULL;
#if defined(CONFIG_EBML_WRITING)
        MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
        ebml_element *Elt, *Elt2;
        if (Element->Lacing == LACING_AUTO)
            Element->Lacing = GetBestLacingType(Element,ForProfile);

        assert(Element->WriteTrack!=NULL);
        Elt = EBML_MasterFindChild(Element->WriteTrack, MATROSKA_getContextContentEncodings());
        if (Elt)
        {
            Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncoding());
            if (EBML_MasterChildren(Elt))
            {
                if (EBML_MasterNext(Elt))
                    return ERR_INVALID_DATA; // TODO support cascaded compression/encryption

                Elt2 = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncodingScope());
                if (Elt2)
                    CompressionScope = EBML_IntegerValue((ebml_integer*)Elt2);

                Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompression());
                if (!Elt)
                    return ERR_INVALID_DATA; // TODO: support encryption

                Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
                if (Header)
                    CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
                bool_t CanCompress = 0;
                if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                    CanCompress = 1;
#if defined(CONFIG_ZLIB)
                else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                    CanCompress = 1;
#endif
                if (!CanCompress)
                    return ERR_INVALID_DATA;

                if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                    Header = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompSettings());
            }
        }
#else
        assert(Element->Lacing!=LACING_AUTO);
#endif

        if (Element->Lacing == LACING_NONE)
        {
            assert(ARRAYCOUNT(Element->SizeList,int32_t) == 1);
            Element->Base.Base.DataSize = GetBlockHeadSize(Element) + GetBlockFrameSize(Element,0,Header, CompressionAlgo, CompressionScope);
        }
        else if (Element->Lacing == LACING_EBML)
        {
            size_t i;
            filepos_t PrevSize, Size;
            filepos_t Result = GetBlockHeadSize(Element) + 1; // 1 for the number of frames
            Size = GetBlockFrameSize(Element,0,Header, CompressionAlgo, CompressionScope);
            Result += EBML_CodedSizeLength(Size,0,1) + Size;
            for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                PrevSize = Size;
                Size = GetBlockFrameSize(Element,i,Header, CompressionAlgo, CompressionScope);
                Result += Size + EBML_CodedSizeLengthSigned(Size - PrevSize,0);
            }
            Result += GetBlockFrameSize(Element,i,Header, CompressionAlgo, CompressionScope);
            Element->Base.Base.DataSize = Result;
        }
        else if (Element->Lacing == LACING_XIPH)
        {
            size_t i;
            filepos_t Size;
            filepos_t Result = GetBlockHeadSize(Element) + 1; // 1 for the number of frames
            for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                Size = GetBlockFrameSize(Element,i,Header, CompressionAlgo, CompressionScope);
                Result += (Size / 0xFF + 1) + Size;
            }
            Result += GetBlockFrameSize(Element,i,Header, CompressionAlgo, CompressionScope);
            Element->Base.Base.DataSize = Result;
        }
        else if (Element->Lacing == LACING_FIXED)
        {
            size_t i;
            filepos_t Result = GetBlockHeadSize(Element) + 1; // 1 for the number of frames
            for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t);++i)
                Result += GetBlockFrameSize(Element,i,Header, CompressionAlgo, CompressionScope);
            Element->Base.Base.DataSize = Result;
        }
#ifdef TODO
        char LacingHere;
        // compute the final size of the data
        switch (ARRAYCOUNT(Element->SizeList,int32_t))
        {
            case 0:
                Element->Base.Base.DataSize = 0;
                break;
            case 1:
                Element->Base.Base.DataSize = 4 + *ARRAYBEGIN(Element->SizeList,int32_t);
                break;
            default:
                Element->Base.Base.DataSize = 4 + 1; // 1 for the lacing head
                if (Element->Lacing == LACING_AUTO)
                    LacingHere = GetBestLacingType(Element,ForProfile);
                else
                    LacingHere = Element->Lacing;
                switch (LacingHere)
                {
                case LACING_XIPH:
                    for (i=0; i<myBuffers.size()-1; i++) {
                        SetSize_(GetSize() + myBuffers[i]->DataSize() + (myBuffers[i]->DataSize() / 0xFF + 1));
                    }
                    break;
                case LACING_EBML:
                    SetSize_(GetSize() + myBuffers[0]->DataSize() + CodedSizeLength(myBuffers[0]->DataSize(), 0, IsFiniteSize()));
                    for (i=1; i<myBuffers.size()-1; i++) {
                        SetSize_(GetSize() + myBuffers[i]->DataSize() + CodedSizeLengthSigned(int64(myBuffers[i]->DataSize()) - int64(myBuffers[i-1]->DataSize()), 0));
                    }
                    break;
                case LACING_FIXED:
                    for (i=0; i<myBuffers.size()-1; i++) {
                        SetSize_(GetSize() + myBuffers[i]->DataSize());
                    }
                    break;
                default:
                    assert(0);
                }
                // DataSize of the last frame (not in lace)
                SetSize_(GetSize() + myBuffers[i]->DataSize());
                break;
        }

        if (Element->Base.Base.DataSize && Element->TrackNumber >= 0x80)
            ++Element->Base.Base.DataSize; // the size will be coded with one more octet
#endif
    }

    // skip the EBML_BINARY_CLASS version as we have another internal buffer
    return INHERITED(Element,ebml_element_vmt,EBML_BINARY_CLASS)->UpdateDataSize(Element, bWithDefault, bForceWithoutMandatory, ForProfile);
}